

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

void getRGB(Image *image,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool isSwitch)

{
  uint8_t uVar1;
  pointer pCVar2;
  iterator __begin1;
  pointer pCVar3;
  long lVar4;
  ulong __n;
  
  pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (ulong)((image->size).width << 2);
  memcpy(pCVar2,(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,__n);
  pCVar3 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__n < (ulong)((long)(image->colorData).super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pCVar3)) {
    lVar4 = 0;
    do {
      (&pCVar2->r)[__n] =
           (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start[__n] + (&pCVar2->r)[lVar4];
      __n = __n + 1;
      pCVar3 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 1;
    } while (__n < (ulong)((long)(image->colorData).
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pCVar3));
  }
  if (!isSwitch) {
    pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
      uVar1 = pCVar3->b;
      pCVar3->b = pCVar3->r;
      pCVar3->r = uVar1;
    }
  }
  return;
}

Assistant:

void getRGB(Image &image, const std::vector<uint8_t> &data, bool isSwitch) {
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(start, data.data(), scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		start[i] = start[i - scanline] + data[i];
	}
	if (!isSwitch) { swapBR(image); }
}